

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.cpp
# Opt level: O3

void __thiscall
chrono::ChTimestepperEulerImplicitLinearized::Advance
          (ChTimestepperEulerImplicitLinearized *this,double dt)

{
  ChState *pCVar1;
  ChStateDelta *pCVar2;
  double *pdVar3;
  double *pdVar4;
  ChVectorDynamic<> *this_00;
  ChVectorDynamic<> *pCVar5;
  ChVectorDynamic<> *pCVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ChIntegrable *pCVar10;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  ChIntegrable *pCVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  int iVar32;
  Index index_1;
  Index index;
  ulong uVar33;
  long lVar34;
  Index index_2;
  ulong uVar35;
  Index size;
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined8 in_XMM0_Qb;
  ActualDstType actualDst;
  ChStateDelta local_d0;
  double local_b8;
  undefined8 uStack_b0;
  double *local_a0;
  ChIntegrable *local_98;
  ChStateDelta *local_90;
  ChState *local_88;
  ChVectorDynamic<> *local_80;
  ChVectorDynamic<> *local_78;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_70;
  ChStateDelta local_48;
  
  pCVar10 = (this->super_ChTimestepperIIorder).super_ChTimestepper.integrable;
  pCVar1 = &(this->super_ChTimestepperIIorder).X;
  pCVar2 = &(this->super_ChTimestepperIIorder).V;
  (*pCVar10->_vptr_ChIntegrable[0x15])(pCVar10,pCVar1,pCVar2,&(this->super_ChTimestepperIIorder).A);
  iVar32 = (*pCVar10->_vptr_ChIntegrable[2])(pCVar10);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->Dl).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar32
            );
  lVar34 = (this->Dl).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if (-1 < lVar34) {
    if (lVar34 != 0) {
      memset((this->Dl).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data,0,lVar34 << 3);
    }
    pCVar5 = &this->R;
    iVar32 = (*pCVar10->_vptr_ChIntegrable[0x13])(pCVar10);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pCVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar32)
    ;
    lVar34 = (this->R).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (-1 < lVar34) {
      if (lVar34 != 0) {
        memset((pCVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data,0,lVar34 << 3);
      }
      pCVar6 = &this->Qc;
      iVar32 = (*pCVar10->_vptr_ChIntegrable[2])(pCVar10);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&pCVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 (long)iVar32);
      lVar34 = (this->Qc).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      if (-1 < lVar34) {
        if (lVar34 != 0) {
          memset((pCVar6->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data,0,lVar34 << 3);
        }
        this_00 = &(this->super_ChTimestepperIIorder).super_ChTimestepper.L;
        local_78 = pCVar6;
        iVar32 = (*pCVar10->_vptr_ChIntegrable[2])(pCVar10);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                   (long)iVar32);
        lVar34 = (this->super_ChTimestepperIIorder).super_ChTimestepper.L.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        if (-1 < lVar34) {
          if (lVar34 != 0) {
            memset((this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data,0,lVar34 << 3);
          }
          local_a0 = &(this->super_ChTimestepperIIorder).super_ChTimestepper.T;
          local_80 = pCVar5;
          (*pCVar10->_vptr_ChIntegrable[0x16])(pCVar10,pCVar1,pCVar2);
          (*pCVar10->_vptr_ChIntegrable[8])(pCVar10);
          uVar11 = (this->super_ChTimestepperIIorder).super_ChTimestepper.L.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
          if (-1 < (long)uVar11) {
            pdVar12 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            uVar33 = uVar11 & 0x7ffffffffffffff8;
            if (7 < uVar11) {
              auVar36._8_8_ = 0;
              auVar36._0_8_ = dt;
              auVar37 = vbroadcastsd_avx512f(auVar36);
              uVar35 = 0;
              do {
                auVar38 = vmulpd_avx512f(auVar37,*(undefined1 (*) [64])(pdVar12 + uVar35));
                *(undefined1 (*) [64])(pdVar12 + uVar35) = auVar38;
                uVar35 = uVar35 + 8;
              } while (uVar35 < uVar33);
            }
            if ((long)uVar33 < (long)uVar11) {
              auVar7._8_8_ = 0;
              auVar7._0_8_ = dt;
              auVar37 = vbroadcastsd_avx512f(auVar7);
              auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar39 = vpbroadcastq_avx512f();
              uVar35 = 0;
              do {
                auVar40 = vpbroadcastq_avx512f();
                auVar40 = vporq_avx512f(auVar40,auVar38);
                uVar22 = vpcmpuq_avx512f(auVar40,auVar39,2);
                pdVar13 = pdVar12 + uVar33 + uVar35;
                auVar40._8_8_ = (ulong)((byte)(uVar22 >> 1) & 1) * (long)pdVar13[1];
                auVar40._0_8_ = (ulong)((byte)uVar22 & 1) * (long)*pdVar13;
                auVar40._16_8_ = (ulong)((byte)(uVar22 >> 2) & 1) * (long)pdVar13[2];
                auVar40._24_8_ = (ulong)((byte)(uVar22 >> 3) & 1) * (long)pdVar13[3];
                auVar40._32_8_ = (ulong)((byte)(uVar22 >> 4) & 1) * (long)pdVar13[4];
                auVar40._40_8_ = (ulong)((byte)(uVar22 >> 5) & 1) * (long)pdVar13[5];
                auVar40._48_8_ = (ulong)((byte)(uVar22 >> 6) & 1) * (long)pdVar13[6];
                auVar40._56_8_ = (uVar22 >> 7) * (long)pdVar13[7];
                auVar40 = vmulpd_avx512f(auVar40,auVar37);
                pdVar13 = pdVar12 + uVar33 + uVar35;
                bVar15 = (bool)((byte)uVar22 & 1);
                bVar16 = (bool)((byte)(uVar22 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar22 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar22 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar22 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar22 >> 5) & 1);
                bVar21 = (bool)((byte)(uVar22 >> 6) & 1);
                *pdVar13 = (double)((ulong)bVar15 * auVar40._0_8_ | (ulong)!bVar15 * (long)*pdVar13)
                ;
                pdVar13[1] = (double)((ulong)bVar16 * auVar40._8_8_ |
                                     (ulong)!bVar16 * (long)pdVar13[1]);
                pdVar13[2] = (double)((ulong)bVar17 * auVar40._16_8_ |
                                     (ulong)!bVar17 * (long)pdVar13[2]);
                pdVar13[3] = (double)((ulong)bVar18 * auVar40._24_8_ |
                                     (ulong)!bVar18 * (long)pdVar13[3]);
                pdVar13[4] = (double)((ulong)bVar19 * auVar40._32_8_ |
                                     (ulong)!bVar19 * (long)pdVar13[4]);
                pdVar13[5] = (double)((ulong)bVar20 * auVar40._40_8_ |
                                     (ulong)!bVar20 * (long)pdVar13[5]);
                pdVar13[6] = (double)((ulong)bVar21 * auVar40._48_8_ |
                                     (ulong)!bVar21 * (long)pdVar13[6]);
                pdVar13[7] = (double)((uVar22 >> 7) * auVar40._56_8_ |
                                     (ulong)!SUB81(uVar22 >> 7,0) * (long)pdVar13[7]);
                uVar35 = uVar35 + 8;
              } while ((((uint)uVar11 & 7) + 7 & 0xfffffff8) != uVar35);
            }
            pdVar12 = (this->super_ChTimestepperIIorder).V.super_ChVectorDynamic<double>.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data;
            uVar11 = (this->super_ChTimestepperIIorder).V.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            ;
            local_90 = pCVar2;
            local_88 = pCVar1;
            if (((this->Vold).super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
                 uVar11) &&
               (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                          ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Vold,
                           uVar11,1),
               (this->Vold).super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
               uVar11)) {
              __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                            "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                           );
            }
            pCVar5 = local_80;
            pCVar2 = local_90;
            pdVar13 = (this->Vold).super_ChVectorDynamic<double>.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data;
            uVar33 = uVar11 + 7;
            if (-1 < (long)uVar11) {
              uVar33 = uVar11;
            }
            uVar33 = uVar33 & 0xfffffffffffffff8;
            if (7 < (long)uVar11) {
              lVar34 = 0;
              do {
                pdVar3 = pdVar12 + lVar34;
                dVar24 = pdVar3[1];
                dVar25 = pdVar3[2];
                dVar26 = pdVar3[3];
                dVar27 = pdVar3[4];
                dVar28 = pdVar3[5];
                dVar29 = pdVar3[6];
                dVar30 = pdVar3[7];
                pdVar4 = pdVar13 + lVar34;
                *pdVar4 = *pdVar3;
                pdVar4[1] = dVar24;
                pdVar4[2] = dVar25;
                pdVar4[3] = dVar26;
                pdVar4[4] = dVar27;
                pdVar4[5] = dVar28;
                pdVar4[6] = dVar29;
                pdVar4[7] = dVar30;
                lVar34 = lVar34 + 8;
              } while (lVar34 < (long)uVar33);
            }
            if ((long)uVar33 < (long)uVar11) {
              do {
                pdVar13[uVar33] = pdVar12[uVar33];
                uVar33 = uVar33 + 1;
              } while (uVar11 != uVar33);
            }
            (this->Vold).integrable = (this->super_ChTimestepperIIorder).V.integrable;
            (*pCVar10->_vptr_ChIntegrable[0xe])(pCVar10,local_80);
            (*pCVar10->_vptr_ChIntegrable[0x1d])(0x3ff0000000000000,pCVar10,pCVar5,pCVar2);
            pCVar6 = local_78;
            local_b8 = 1.0 / dt;
            uStack_b0 = 0;
            (*pCVar10->_vptr_ChIntegrable[0x10])
                      (local_b8,(this->super_ChTimestepperIIorder).super_ChTimestepper.Qc_clamping,
                       pCVar10,local_78,
                       (ulong)(this->super_ChTimestepperIIorder).super_ChTimestepper.Qc_do_clamp);
            (*pCVar10->_vptr_ChIntegrable[0x11])(0x3ff0000000000000,pCVar10,pCVar6);
            pCVar1 = local_88;
            auVar31._8_8_ = in_XMM0_Qb;
            auVar31._0_8_ = dt;
            auVar23._8_8_ = 0x8000000000000000;
            auVar23._0_8_ = 0x8000000000000000;
            auVar36 = vxorpd_avx512vl(auVar31,auVar23);
            local_98 = pCVar10;
            (*pCVar10->_vptr_ChIntegrable[0x1c])
                      (0x3ff0000000000000,auVar36._0_8_,auVar36._0_8_ * dt,
                       dt + (this->super_ChTimestepperIIorder).super_ChTimestepper.T,pCVar10,pCVar2,
                       this_00,pCVar5,pCVar6,local_88,pCVar2,0,0,1);
            pCVar10 = local_98;
            uVar11 = (this->super_ChTimestepperIIorder).super_ChTimestepper.L.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            ;
            if (-1 < (long)uVar11) {
              pdVar12 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              uVar33 = uVar11 & 0x7ffffffffffffff8;
              if (7 < uVar11) {
                auVar8._8_8_ = 0;
                auVar8._0_8_ = local_b8;
                auVar37 = vbroadcastsd_avx512f(auVar8);
                uVar35 = 0;
                do {
                  auVar38 = vmulpd_avx512f(auVar37,*(undefined1 (*) [64])(pdVar12 + uVar35));
                  *(undefined1 (*) [64])(pdVar12 + uVar35) = auVar38;
                  uVar35 = uVar35 + 8;
                } while (uVar35 < uVar33);
              }
              if ((long)uVar33 < (long)uVar11) {
                auVar9._8_8_ = 0;
                auVar9._0_8_ = local_b8;
                auVar37 = vbroadcastsd_avx512f(auVar9);
                auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                auVar39 = vpbroadcastq_avx512f();
                uVar35 = 0;
                do {
                  auVar40 = vpbroadcastq_avx512f();
                  auVar40 = vporq_avx512f(auVar40,auVar38);
                  uVar22 = vpcmpuq_avx512f(auVar40,auVar39,2);
                  pdVar13 = pdVar12 + uVar33 + uVar35;
                  auVar41._8_8_ = (ulong)((byte)(uVar22 >> 1) & 1) * (long)pdVar13[1];
                  auVar41._0_8_ = (ulong)((byte)uVar22 & 1) * (long)*pdVar13;
                  auVar41._16_8_ = (ulong)((byte)(uVar22 >> 2) & 1) * (long)pdVar13[2];
                  auVar41._24_8_ = (ulong)((byte)(uVar22 >> 3) & 1) * (long)pdVar13[3];
                  auVar41._32_8_ = (ulong)((byte)(uVar22 >> 4) & 1) * (long)pdVar13[4];
                  auVar41._40_8_ = (ulong)((byte)(uVar22 >> 5) & 1) * (long)pdVar13[5];
                  auVar41._48_8_ = (ulong)((byte)(uVar22 >> 6) & 1) * (long)pdVar13[6];
                  auVar41._56_8_ = (uVar22 >> 7) * (long)pdVar13[7];
                  auVar40 = vmulpd_avx512f(auVar37,auVar41);
                  pdVar13 = pdVar12 + uVar33 + uVar35;
                  bVar15 = (bool)((byte)uVar22 & 1);
                  bVar16 = (bool)((byte)(uVar22 >> 1) & 1);
                  bVar17 = (bool)((byte)(uVar22 >> 2) & 1);
                  bVar18 = (bool)((byte)(uVar22 >> 3) & 1);
                  bVar19 = (bool)((byte)(uVar22 >> 4) & 1);
                  bVar20 = (bool)((byte)(uVar22 >> 5) & 1);
                  bVar21 = (bool)((byte)(uVar22 >> 6) & 1);
                  *pdVar13 = (double)((ulong)bVar15 * auVar40._0_8_ |
                                     (ulong)!bVar15 * (long)*pdVar13);
                  pdVar13[1] = (double)((ulong)bVar16 * auVar40._8_8_ |
                                       (ulong)!bVar16 * (long)pdVar13[1]);
                  pdVar13[2] = (double)((ulong)bVar17 * auVar40._16_8_ |
                                       (ulong)!bVar17 * (long)pdVar13[2]);
                  pdVar13[3] = (double)((ulong)bVar18 * auVar40._24_8_ |
                                       (ulong)!bVar18 * (long)pdVar13[3]);
                  pdVar13[4] = (double)((ulong)bVar19 * auVar40._32_8_ |
                                       (ulong)!bVar19 * (long)pdVar13[4]);
                  pdVar13[5] = (double)((ulong)bVar20 * auVar40._40_8_ |
                                       (ulong)!bVar20 * (long)pdVar13[5]);
                  pdVar13[6] = (double)((ulong)bVar21 * auVar40._48_8_ |
                                       (ulong)!bVar21 * (long)pdVar13[6]);
                  pdVar13[7] = (double)((uVar22 >> 7) * auVar40._56_8_ |
                                       (ulong)!SUB81(uVar22 >> 7,0) * (long)pdVar13[7]);
                  uVar35 = uVar35 + 8;
                } while ((((uint)uVar11 & 7) + 7 & 0xfffffff8) != uVar35);
              }
              local_70.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data = (double *)0x0;
              local_70.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows = 0;
              local_70.
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_data = (this->Vold).super_ChVectorDynamic<double>.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
              local_70.
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              .
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_rows.m_value =
                   (this->Vold).super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
              if (local_70.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                  .m_rows.m_value < 0 &&
                  local_70.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                  .m_data != (double *)0x0) {
                __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                              ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                              "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                             );
              }
              ChStateDelta::operator-(&local_48,pCVar2,&local_70);
              ChStateDelta::operator*(&local_d0,&local_48,local_b8);
              (*pCVar10->_vptr_ChIntegrable[0x19])(pCVar10,&local_d0);
              if (local_d0.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
                  (double *)0x0) {
                free((void *)local_d0.super_ChVectorDynamic<double>.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[-1]);
              }
              if (local_48.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
                  (double *)0x0) {
                free((void *)local_48.super_ChVectorDynamic<double>.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[-1]);
              }
              if (local_70.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data != (double *)0x0) {
                free((void *)local_70.m_object.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[-1]);
              }
              ChStateDelta::operator*(&local_d0,pCVar2,dt);
              ChState::ChState((ChState *)&local_70,pCVar1);
              pCVar14 = (this->super_ChTimestepperIIorder).X.integrable;
              (*pCVar14->_vptr_ChIntegrable[0xb])(pCVar14,pCVar1,&local_70,&local_d0);
              if (local_70.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                  .m_data != (double *)0x0) {
                free((void *)local_70.
                             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                             .
                             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                             .m_data[-1]);
              }
              if (local_d0.super_ChVectorDynamic<double>.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
                  (double *)0x0) {
                free((void *)local_d0.super_ChVectorDynamic<double>.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[-1]);
              }
              *local_a0 = dt + *local_a0;
              (*pCVar10->_vptr_ChIntegrable[0x17])(pCVar10,pCVar1,pCVar2,1);
              (*pCVar10->_vptr_ChIntegrable[9])(pCVar10,this_00);
              return;
            }
          }
        }
      }
    }
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

void ChTimestepperEulerImplicitLinearized::Advance(const double dt) {
    // downcast
    ChIntegrableIIorder* mintegrable = (ChIntegrableIIorder*)this->integrable;

    // setup main vectors
    mintegrable->StateSetup(X, V, A);

    // setup auxiliary vectors
    Dl.setZero(mintegrable->GetNconstr());
    R.setZero(mintegrable->GetNcoords_v());
    Qc.setZero(mintegrable->GetNconstr());
    L.setZero(mintegrable->GetNconstr());

    mintegrable->StateGather(X, V, T);  // state <- system

    mintegrable->StateGatherReactions(L);  // state <- system (may be needed for warm starting StateSolveCorrection)
    L *= dt;                               // because reactions = forces, here L = impulses

    Vold = V;

    // solve only 1st NR step, using v_new = 0, so  Dv = v_new , therefore
    //
    // [ M - dt*dF/dv - dt^2*dF/dx    Cq' ] [ Dv     ] = [ M*(v_old - v_new) + dt*f]
    // [ Cq                           0   ] [ -dt*Dl ] = [ -C/dt - Ct ]
    //
    // becomes the Anitescu/Trinkle timestepper:
    //
    // [ M - dt*dF/dv - dt^2*dF/dx    Cq' ] [ v_new  ] = [ M*(v_old) + dt*f]
    // [ Cq                           0   ] [ -dt*l  ] = [ -C/dt - Ct ]

    mintegrable->LoadResidual_F(R, dt);
    mintegrable->LoadResidual_Mv(R, V, 1.0);
    mintegrable->LoadConstraint_C(Qc, 1.0 / dt, Qc_do_clamp, Qc_clamping);
    mintegrable->LoadConstraint_Ct(Qc, 1.0);

    mintegrable->StateSolveCorrection(  //
        V, L, R, Qc,                    //
        1.0,                            // factor for  M
        -dt,                            // factor for  dF/dv
        -dt * dt,                       // factor for  dF/dx
        X, V, T + dt,                   // not needed
        false,                          // do not scatter update to Xnew Vnew T+dt before computing correction
        false,                          // full update? (not used, since no scatter)
        true                            // force a call to the solver's Setup() function
    );

    L *= (1.0 / dt);  // Note it is not -(1.0/dt) because we assume StateSolveCorrection already flips sign of Dl

    mintegrable->StateScatterAcceleration(
        (V - Vold) * (1 / dt));  // -> system auxiliary data (i.e acceleration as measure, fits DVI/MDI)

    X += V * dt;

    T += dt;

    mintegrable->StateScatter(X, V, T, true);  // state -> system
    mintegrable->StateScatterReactions(L);     // -> system auxiliary data
}